

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_server_discovery.c
# Opt level: O3

pcp_errno psd_fill_pcp_server_src(pcp_server_t *s)

{
  pcp_errno pVar1;
  char *pcVar2;
  uint32_t src_scope_id;
  in6_addr src_ip;
  uint32_t local_2c;
  anon_union_16_3_a3f0114d_for___in6_u local_28;
  
  local_2c = 0;
  if (s == (pcp_server_t *)0x0) {
    pVar1 = PCP_ERR_BAD_ARGS;
  }
  else {
    *(undefined1 (*) [16])((s->pcp_server_saddr).__ss_padding + 0x6e) = (undefined1  [16])0x0;
    (s->pcp_server_saddr).__ss_padding[0x5e] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x5f] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x60] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x61] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x62] = '\0';
    (s->pcp_server_saddr).__ss_padding[99] = '\0';
    (s->pcp_server_saddr).__ss_padding[100] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x65] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x66] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x67] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x68] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x69] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x6a] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x6b] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x6c] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x6d] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x4e] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x4f] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x50] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x51] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x52] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x53] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x54] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x55] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x56] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x57] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x58] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x59] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x5a] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x5b] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x5c] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x5d] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x3e] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x3f] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x40] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x41] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x42] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x43] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x44] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x45] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x46] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x47] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x48] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x49] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x4a] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x4b] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x4c] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x4d] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x2e] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x2f] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x30] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x31] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x32] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x33] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x34] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x35] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x36] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x37] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x38] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x39] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x3a] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x3b] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x3c] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x3d] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x1e] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x1f] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x20] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x21] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x22] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x23] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x24] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x25] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x26] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x27] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x28] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x29] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x2a] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x2b] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x2c] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x2d] = '\0';
    (s->pcp_server_saddr).__ss_padding[0xe] = '\0';
    (s->pcp_server_saddr).__ss_padding[0xf] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x10] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x11] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x12] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x13] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x14] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x15] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x16] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x17] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x18] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x19] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x1a] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x1b] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x1c] = '\0';
    (s->pcp_server_saddr).__ss_padding[0x1d] = '\0';
    (s->pcp_server_saddr).ss_family = 0;
    (s->pcp_server_saddr).__ss_padding[0] = '\0';
    (s->pcp_server_saddr).__ss_padding[1] = '\0';
    (s->pcp_server_saddr).__ss_padding[2] = '\0';
    (s->pcp_server_saddr).__ss_padding[3] = '\0';
    (s->pcp_server_saddr).__ss_padding[4] = '\0';
    (s->pcp_server_saddr).__ss_padding[5] = '\0';
    (s->pcp_server_saddr).__ss_padding[6] = '\0';
    (s->pcp_server_saddr).__ss_padding[7] = '\0';
    (s->pcp_server_saddr).__ss_padding[8] = '\0';
    (s->pcp_server_saddr).__ss_padding[9] = '\0';
    (s->pcp_server_saddr).__ss_padding[10] = '\0';
    (s->pcp_server_saddr).__ss_padding[0xb] = '\0';
    (s->pcp_server_saddr).__ss_padding[0xc] = '\0';
    (s->pcp_server_saddr).__ss_padding[0xd] = '\0';
    local_28 = (anon_union_16_3_a3f0114d_for___in6_u)0x0;
    (s->pcp_server_saddr).ss_family = 10;
    pVar1 = PCP_ERR_BAD_AFINET;
    if (s->af != 2) {
      pcp_fill_sockaddr((sockaddr *)&s->pcp_server_saddr,(in6_addr *)s->pcp_ip,s->pcp_port,1,
                        s->pcp_scope_id);
      inet_ntop(10,(s->pcp_server_saddr).__ss_padding + 6,s->pcp_server_paddr,0x2e);
      pcVar2 = findsaddr6((sockaddr_in6 *)&s->pcp_server_saddr,(in6_addr *)&local_28,&local_2c);
      if (pcVar2 == (char *)0x0) {
        s->src_ip[0] = local_28.__u6_addr32[0];
        s->src_ip[1] = local_28.__u6_addr32[1];
        s->src_ip[2] = local_28.__u6_addr32[2];
        s->src_ip[3] = local_28.__u6_addr32[3];
        if ((local_28.__u6_addr32[0] & 0xc0ff) == 0x80fe && s->pcp_scope_id == 0) {
          s->pcp_scope_id = local_2c;
        }
        s->server_state = pss_ping;
        (s->next_timeout).tv_sec = 0;
        (s->next_timeout).tv_usec = 0;
        pVar1 = PCP_ERR_SUCCESS;
      }
      else {
        pcp_logger(PCP_LOGLVL_WARN,"Error (%s) occurred while registering a new PCP server %s",
                   pcVar2,s->pcp_server_paddr);
        pVar1 = PCP_ERR_UNKNOWN;
      }
    }
  }
  return pVar1;
}

Assistant:

static pcp_errno psd_fill_pcp_server_src(pcp_server_t *s) {
    struct in6_addr src_ip;
    uint32_t src_scope_id = 0;
    const char *err = NULL;

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    if (!s) {
        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return PCP_ERR_BAD_ARGS;
    }

    memset(&s->pcp_server_saddr, 0, sizeof(s->pcp_server_saddr));
    memset(&src_ip, 0, sizeof(src_ip));

#ifndef PCP_USE_IPV6_SOCKET
    s->pcp_server_saddr.ss_family = AF_INET;
    if (s->af == AF_INET) {
        ((struct sockaddr_in *)&s->pcp_server_saddr)->sin_addr.s_addr =
            s->pcp_ip[3];
        ((struct sockaddr_in *)&s->pcp_server_saddr)->sin_port = s->pcp_port;
        SET_SA_LEN(&s->pcp_server_saddr, sizeof(struct sockaddr_in));
        inet_ntop(
            AF_INET,
            (void *)&((struct sockaddr_in *)&s->pcp_server_saddr)->sin_addr,
            s->pcp_server_paddr, sizeof(s->pcp_server_paddr));

        err = findsaddr((struct sockaddr_in *)&s->pcp_server_saddr, &src_ip);
        if (err) {
            PCP_LOG(PCP_LOGLVL_WARN,
                    "Error (%s) occurred while registering a new "
                    "PCP server %s",
                    err, s->pcp_server_paddr);

            PCP_LOG_END(PCP_LOGLVL_DEBUG);
            return PCP_ERR_UNKNOWN;
        }
        s->src_ip[0] = 0;

        s->src_ip[1] = 0;
        s->src_ip[2] = htonl(0xFFFF);
        s->src_ip[3] = S6_ADDR32(&src_ip)[3];
    } else {
        PCP_LOG(PCP_LOGLVL_WARN, "%s",
                "IPv6 is disabled and IPv6 address of PCP server occurred");

        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return PCP_ERR_BAD_AFINET;
    }
#else  // PCP_USE_IPV6_SOCKET
    s->pcp_server_saddr.ss_family = AF_INET6;
    if (s->af == AF_INET) {
        return PCP_ERR_BAD_AFINET; // should never happen
    }
    pcp_fill_sockaddr((struct sockaddr *)&s->pcp_server_saddr,
                      (struct in6_addr *)&s->pcp_ip, s->pcp_port, 1,
                      s->pcp_scope_id);

    inet_ntop(AF_INET6,
              (void *)&((struct sockaddr_in6 *)&s->pcp_server_saddr)->sin6_addr,
              s->pcp_server_paddr, sizeof(s->pcp_server_paddr));

    err = findsaddr6((struct sockaddr_in6 *)&s->pcp_server_saddr, &src_ip,
                     &src_scope_id);
    if (err) {
        PCP_LOG(PCP_LOGLVL_WARN,
                "Error (%s) occurred while registering a new "
                "PCP server %s",
                err, s->pcp_server_paddr);

        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return PCP_ERR_UNKNOWN;
    }
    s->src_ip[0] = S6_ADDR32(&src_ip)[0];
    s->src_ip[1] = S6_ADDR32(&src_ip)[1];
    s->src_ip[2] = S6_ADDR32(&src_ip)[2];
    s->src_ip[3] = S6_ADDR32(&src_ip)[3];

    if ((s->pcp_scope_id == 0) && (IN6_IS_ADDR_LINKLOCAL(&src_ip))) {
        s->pcp_scope_id = src_scope_id;
    }
#endif // PCP_USE_IPV6_SOCKET
    s->server_state = pss_ping;
    s->next_timeout.tv_sec = 0;
    s->next_timeout.tv_usec = 0;

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return PCP_ERR_SUCCESS;
}